

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

void __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,_16>::filter::filter
          (filter *this,string_view filter)

{
  char *in_R8;
  basic_string_view<char,_std::char_traits<char>_> input;
  
  input._M_len = filter._M_str;
  input._M_str = ".";
  utility::split<std::basic_string_view<char,std::char_traits<char>>,char_const*>
            (&this->path_,(utility *)filter._M_len,input,in_R8);
  return;
}

Assistant:

constexpr /*explicit(false)*/ filter(std::string_view filter = {})
          : path_{utility::split(filter, delim)} {}